

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

int Fraig_CompareSimInfo(Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int iWordLast,int fUseRand)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                  ,0x162,"int Fraig_CompareSimInfo(Fraig_Node_t *, Fraig_Node_t *, int, int)");
  }
  if (((ulong)pNode2 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                  ,0x163,"int Fraig_CompareSimInfo(Fraig_Node_t *, Fraig_Node_t *, int, int)");
  }
  if (fUseRand == 0) {
    if (pNode1->uHashD == pNode2->uHashD) {
      uVar3 = 0;
      uVar4 = (ulong)(uint)iWordLast;
      if (iWordLast < 1) {
        uVar4 = uVar3;
      }
      do {
        if (uVar4 == uVar3) {
          return 1;
        }
        puVar1 = pNode1->puSimD + uVar3;
        puVar2 = pNode2->puSimD + uVar3;
        uVar3 = uVar3 + 1;
      } while (*puVar1 == *puVar2);
    }
  }
  else if (pNode1->uHashR == pNode2->uHashR) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)iWordLast;
    if (iWordLast < 1) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == uVar3) {
        return 1;
      }
      puVar1 = pNode1->puSimR + uVar3;
      puVar2 = pNode2->puSimR + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == *puVar2);
  }
  return 0;
}

Assistant:

int Fraig_CompareSimInfo( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int iWordLast, int fUseRand )
{
    int i;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    if ( fUseRand )
    {
        // if their signatures differ, skip
        if ( pNode1->uHashR != pNode2->uHashR )
            return 0;
        // check the simulation info
        for ( i = 0; i < iWordLast; i++ )
            if ( pNode1->puSimR[i] != pNode2->puSimR[i] )
                return 0;
    }
    else
    {
        // if their signatures differ, skip
        if ( pNode1->uHashD != pNode2->uHashD )
            return 0;
        // check the simulation info
        for ( i = 0; i < iWordLast; i++ )
            if ( pNode1->puSimD[i] != pNode2->puSimD[i] )
                return 0;
    }
    return 1;
}